

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

bool FindMeshNode(Ref<glTF2::Node> *nodeIn,Ref<glTF2::Node> *meshNode,string *meshID)

{
  Node *pNVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  pointer pRVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  string local_50;
  
  pNVar1 = (nodeIn->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>).
           _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
  bVar9 = *(pointer *)
           ((long)&(pNVar1->meshes).
                   super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
           + 8) != *(pointer *)
                    &(pNVar1->meshes).
                     super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                     ._M_impl;
  if (bVar9) {
    iVar4 = std::__cxx11::string::compare((string *)meshID);
    if (iVar4 != 0) {
      uVar6 = 1;
      do {
        pNVar1 = (nodeIn->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)
                 ._M_impl.super__Vector_impl_data._M_start[nodeIn->index];
        uVar7 = (long)*(pointer *)
                       ((long)&(pNVar1->meshes).
                               super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                       + 8) -
                *(long *)&(pNVar1->meshes).
                          super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                          ._M_impl >> 4;
        bVar9 = uVar6 < uVar7;
        if (uVar7 <= uVar6) goto LAB_006e9e1e;
        iVar4 = std::__cxx11::string::compare((string *)meshID);
        uVar6 = uVar6 + 1;
      } while (iVar4 != 0);
    }
    meshNode->index = nodeIn->index;
    meshNode->vector = nodeIn->vector;
    if (bVar9) {
      return true;
    }
  }
LAB_006e9e1e:
  pNVar1 = (nodeIn->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>).
           _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
  pRVar5 = *(pointer *)
            &(pNVar1->children).
             super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
             _M_impl;
  bVar9 = *(pointer *)
           ((long)&(pNVar1->children).
                   super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
           + 8) != pRVar5;
  if (bVar9) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      pcVar2 = (meshID->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + meshID->_M_string_length);
      bVar3 = FindMeshNode(pRVar5 + uVar7,meshNode,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar3) {
        return bVar9;
      }
      pNVar1 = (nodeIn->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>).
               _M_impl.super__Vector_impl_data._M_start[nodeIn->index];
      pRVar5 = *(pointer *)
                &(pNVar1->children).
                 super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                 ._M_impl;
      uVar7 = (long)*(pointer *)
                     ((long)&(pNVar1->children).
                             super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                     + 8) - (long)pRVar5 >> 4;
      bVar9 = uVar8 < uVar7;
      bVar3 = uVar8 < uVar7;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  return bVar9;
}

Assistant:

bool FindMeshNode(Ref<Node>& nodeIn, Ref<Node>& meshNode, std::string meshID)
{
    for (unsigned int i = 0; i < nodeIn->meshes.size(); ++i) {
        if (meshID.compare(nodeIn->meshes[i]->id) == 0) {
            meshNode = nodeIn;
            return true;
        }
    }

    for (unsigned int i = 0; i < nodeIn->children.size(); ++i) {
        if(FindMeshNode(nodeIn->children[i], meshNode, meshID)) {
            return true;
        }
    }

    return false;
}